

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

bool __thiscall IR::RegBVOpnd::IsEqualInternal(RegBVOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  IRType IVar4;
  undefined4 *puVar5;
  RegBVOpnd *pRVar6;
  Opnd *opnd_local;
  RegBVOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindRegBV) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x69c,"(m_kind == OpndKindRegBV)","m_kind == OpndKindRegBV");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Opnd::IsRegBVOpnd(opnd);
  if (bVar2) {
    IVar3 = Opnd::GetType(&this->super_Opnd);
    IVar4 = Opnd::GetType(opnd);
    if (IVar3 == IVar4) {
      pRVar6 = Opnd::AsRegBVOpnd(opnd);
      bVar2 = BVUnitT<unsigned_long>::Equal
                        (&this->m_value,(BVUnitT<unsigned_long>)(pRVar6->m_value).word);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool
RegBVOpnd::IsEqualInternal(Opnd *opnd)
{
    Assert(m_kind == OpndKindRegBV);
    if (!opnd->IsRegBVOpnd() || this->GetType() != opnd->GetType())
    {
        return false;
    }

    return m_value.Equal(opnd->AsRegBVOpnd()->m_value);
}